

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_log(int iErrCode,char *zFormat,...)

{
  _func_void_void_ptr_int_char_ptr *p_Var1;
  void *pvVar2;
  char in_AL;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char zMsg [210];
  __va_list_tag local_1f8;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  sqlite3_str local_128;
  char local_108 [224];
  long local_28;
  
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c8 = in_RDX;
  local_1c0 = in_RCX;
  local_1b8 = in_R8;
  local_1b0 = in_R9;
  if (sqlite3Config.xLog != (_func_void_void_ptr_int_char_ptr *)0x0) {
    local_1f8.reg_save_area = local_1d8;
    local_1f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_1f8.gp_offset = 0x10;
    local_1f8.fp_offset = 0x30;
    local_128.zText = local_108;
    local_128.db = (sqlite3 *)0x0;
    local_128.nAlloc = 0xd2;
    local_128.mxAlloc = 0;
    local_128.nChar = 0;
    local_128.accError = '\0';
    local_128.printfFlags = '\0';
    sqlite3_str_vappendf(&local_128,zFormat,&local_1f8);
    pvVar2 = sqlite3Config.pLogArg;
    p_Var1 = sqlite3Config.xLog;
    pcVar3 = sqlite3StrAccumFinish(&local_128);
    (*p_Var1)(pvVar2,iErrCode,pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_log(int iErrCode, const char *zFormat, ...){
  va_list ap;                             /* Vararg list */
  if( sqlite3GlobalConfig.xLog ){
    va_start(ap, zFormat);
    renderLogMsg(iErrCode, zFormat, ap);
    va_end(ap);
  }
}